

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ply_loader.cpp
# Opt level: O2

string * __thiscall
embree::SceneGraph::stringOfTypeTag_abi_cxx11_
          (string *__return_storage_ptr__,SceneGraph *this,Tag ty)

{
  runtime_error *this_00;
  undefined4 in_register_00000014;
  allocator *paVar1;
  char *pcVar2;
  allocator local_19;
  allocator local_18;
  allocator local_17;
  allocator local_16;
  allocator local_15;
  allocator local_14;
  allocator local_13;
  allocator local_12;
  allocator local_11;
  
  switch((ulong)this & 0xffffffff) {
  case 0:
    pcVar2 = "char";
    paVar1 = &local_11;
    break;
  case 1:
    pcVar2 = "uchar";
    paVar1 = &local_12;
    break;
  case 2:
    pcVar2 = "short";
    paVar1 = &local_13;
    break;
  case 3:
    pcVar2 = "ushort";
    paVar1 = &local_14;
    break;
  case 4:
    pcVar2 = "int";
    paVar1 = &local_15;
    break;
  case 5:
    pcVar2 = "uint";
    paVar1 = &local_16;
    break;
  case 6:
    pcVar2 = "float";
    paVar1 = &local_17;
    break;
  case 7:
    pcVar2 = "double";
    paVar1 = &local_18;
    break;
  case 8:
    pcVar2 = "list";
    paVar1 = &local_19;
    break;
  default:
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10,this,CONCAT44(in_register_00000014,ty))
    ;
    std::runtime_error::runtime_error(this_00,"invalid type");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar2,paVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string stringOfTypeTag(Type::Tag ty) {
      if (ty == Type::PTY_CHAR) return "char";
      if (ty == Type::PTY_UCHAR) return "uchar";
      if (ty == Type::PTY_SHORT) return "short";
      if (ty == Type::PTY_USHORT) return "ushort";
      if (ty == Type::PTY_INT) return "int";
      if (ty == Type::PTY_UINT) return "uint";
      if (ty == Type::PTY_FLOAT) return "float";
      if (ty == Type::PTY_DOUBLE) return "double";
      if (ty == Type::PTY_LIST) return "list";
      throw std::runtime_error("invalid type");
      return "";
    }